

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_sec.c
# Opt level: O1

void CRYPTO_secure_free(void *ptr)

{
  size_t __len;
  int iVar1;
  void *__addr;
  uchar *canary_ptr;
  size_t *__addr_00;
  size_t __len_00;
  
  if (ptr == (void *)0x0) {
    return;
  }
  __addr = (void *)(-page_size & (ulong)((long)ptr + -0x10));
  __addr_00 = (size_t *)((long)__addr + page_size * -2);
  if ((void *)(page_size * 2) <= __addr && __addr_00 != (size_t *)0x0) {
    __len = *__addr_00;
    __len_00 = page_size * 3 + __len;
    mprotect(__addr_00,__len_00,3);
    iVar1 = CRYPTO_memcmp((void *)((long)ptr + -0x10),canary,0x10);
    if (iVar1 == 0) {
      explicit_bzero(__addr,__len);
      munlock(__addr,__len);
      munmap(__addr_00,__len_00);
      return;
    }
  }
  abort();
}

Assistant:

void CRYPTO_secure_free(void *ptr)
{
    unsigned char *base_ptr;
    unsigned char *canary_ptr;
    unsigned char *unprotected_ptr;
    size_t         total_size;
    size_t         unprotected_size;

    if (ptr == NULL) {
        return;
    }
    canary_ptr      = ((unsigned char *) ptr) - sizeof canary;
    unprotected_ptr = _unprotected_ptr_from_user_ptr(ptr);
    base_ptr        = unprotected_ptr - page_size * 2U;
    memcpy(&unprotected_size, base_ptr, sizeof unprotected_size);
    total_size = page_size + page_size + unprotected_size + page_size;
    _mprotect_readwrite(base_ptr, total_size);
    if (CRYPTO_memcmp(canary_ptr, canary, sizeof canary) != 0) {
        _out_of_bounds();
    }
# ifndef HAVE_PAGE_PROTECTION
    if (CRYPTO_memcmp(unprotected_ptr + unprotected_size, canary,
                      sizeof canary) != 0) {
        _out_of_bounds();
    }
# endif
    CRYPTO_munlock(unprotected_ptr, unprotected_size);
    _free_aligned(base_ptr, total_size);
}